

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Func::Func(Func *this,string_view name)

{
  Func *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (Func *)name.data_;
  string_view::to_string_abi_cxx11_(&this->name,(string_view *)&this_local);
  FuncDeclaration::FuncDeclaration(&this->decl);
  LocalTypes::LocalTypes(&this->local_types);
  BindingHash::BindingHash(&this->bindings);
  intrusive_list<wabt::Expr>::intrusive_list(&this->exprs);
  return;
}

Assistant:

explicit Func(string_view name) : name(name.to_string()) {}